

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_SetPropertyFunctionList(JSContext *ctx,JSValue obj,JSCFunctionListEntry *tab,int len)

{
  int iVar1;
  ulong uVar2;
  JSAtom prop;
  JSAtom prop_00;
  uint flags;
  ulong uVar3;
  JSValueUnion JVar4;
  int64_t iVar5;
  bool bVar6;
  JSValue obj_00;
  JSValue JVar7;
  JSValue this_obj;
  int64_t iStackY_d0;
  uint flags_00;
  JSValueUnion local_88;
  int64_t iStack_80;
  char local_78 [72];
  
  uVar3 = (ulong)(uint)len;
  if (len < 1) {
    uVar3 = 0;
  }
  do {
    bVar6 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar6) {
      return;
    }
    prop = find_atom(ctx,tab->name);
    if (9 < tab->def_type) {
LAB_00127b77:
      abort();
    }
    flags = (uint)tab->prop_flags;
    switch(tab->def_type) {
    case '\0':
      flags_00 = 1;
      if ((prop != 0xc5) && (flags_00 = flags, prop == 0xce)) {
        flags_00 = 0;
      }
      goto LAB_00127acd;
    default:
      if ((tab->u).alias.name == (char *)0x0) {
        JVar7 = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        snprintf(local_78,0x40,"get %s");
        JVar7 = JS_NewCFunction2(ctx,(JSCFunction *)(tab->u).alias.name,local_78,0,
                                 (uint)(tab->def_type == '\x02') * 2 + JS_CFUNC_getter,
                                 (int)tab->magic);
      }
      local_88.ptr = (void *)(local_88 << 0x20);
      iStack_80 = 3;
      if ((tab->u).func.cfunc.generic != (JSCFunction *)0x0) {
        snprintf(local_78,0x40,"set %s",tab->name);
        _local_88 = JS_NewCFunction2(ctx,(tab->u).func.cfunc.generic,local_78,1,
                                     (uint)(tab->def_type == '\x02') * 2 + JS_CFUNC_setter,
                                     (int)tab->magic);
      }
      JS_DefinePropertyGetSet(ctx,obj,prop,JVar7,_local_88,flags);
      goto LAB_00127ae8;
    case '\x03':
    case '\b':
      flags_00 = flags;
LAB_00127acd:
      JS_DefineAutoInitProperty(ctx,obj,prop,JS_AUTOINIT_ID_PROP,tab,flags_00);
      goto LAB_00127ae8;
    case '\x04':
      JVar7 = (JSValue)ZEXT416((uint)(tab->u).i32);
      break;
    case '\x05':
      uVar2 = (tab->u).i64;
      bVar6 = (long)(int)uVar2 == uVar2;
      JVar4.float64 = (double)(long)uVar2;
      if (bVar6) {
        JVar4.ptr = (void *)(uVar2 & 0xffffffff);
      }
      iVar5 = 7;
      if (bVar6) {
        iVar5 = 0;
      }
      JVar7.tag = iVar5;
      JVar7.u.float64 = JVar4.float64;
      break;
    case '\x06':
      JVar4 = (JSValueUnion)(tab->u).alias.name;
      iStackY_d0 = 7;
      goto LAB_00127a0e;
    case '\a':
      JVar4.float64 = 0.0;
      iStackY_d0 = 3;
LAB_00127a0e:
      JVar7.tag = iStackY_d0;
      JVar7.u.float64 = JVar4.float64;
      break;
    case '\t':
      prop_00 = find_atom(ctx,(tab->u).alias.name);
      iVar1 = (tab->u).alias.base;
      if (iVar1 == 1) {
        iVar5 = ctx->class_proto[2].tag;
        JVar4.ptr = ctx->class_proto[2].u.ptr;
      }
      else if (iVar1 == 0) {
        iVar5 = (ctx->global_obj).tag;
        JVar4.ptr = (ctx->global_obj).u.ptr;
      }
      else {
        iVar5 = obj.tag;
        JVar4 = obj.u;
        if (iVar1 != -1) goto LAB_00127b77;
      }
      obj_00.tag = iVar5;
      obj_00.u.ptr = JVar4.ptr;
      this_obj.tag = iVar5;
      this_obj.u.ptr = JVar4.ptr;
      JVar7 = JS_GetPropertyInternal(ctx,obj_00,prop_00,this_obj,0);
      JS_FreeAtom(ctx,prop_00);
      if (prop == 0xc5) {
        flags = 1;
      }
      else if (prop == 0xce) {
        flags = 0;
      }
    }
    JS_DefinePropertyValue(ctx,obj,prop,JVar7,flags);
LAB_00127ae8:
    JS_FreeAtom(ctx,prop);
    tab = tab + 1;
  } while( true );
}

Assistant:

void JS_SetPropertyFunctionList(JSContext *ctx, JSValueConst obj,
                                const JSCFunctionListEntry *tab, int len)
{
    int i;

    for (i = 0; i < len; i++) {
        const JSCFunctionListEntry *e = &tab[i];
        JSAtom atom = find_atom(ctx, e->name);
        JS_InstantiateFunctionListItem(ctx, obj, atom, e);
        JS_FreeAtom(ctx, atom);
    }
}